

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

istream * safeGetline(istream *is,string *t)

{
  long *plVar1;
  byte *pbVar2;
  bool bVar3;
  uint uVar4;
  sentry se;
  sentry local_19;
  
  t->_M_string_length = 0;
  *(t->_M_dataplus)._M_p = '\0';
  std::istream::sentry::sentry(&local_19,is,true);
  plVar1 = *(long **)(&is->field_0xe8 + (long)is->_vptr_basic_istream[-3]);
  do {
    pbVar2 = (byte *)plVar1[2];
    if (pbVar2 < (byte *)plVar1[3]) {
      uVar4 = (uint)*pbVar2;
      plVar1[2] = (long)(pbVar2 + 1);
    }
    else {
      uVar4 = (**(code **)(*plVar1 + 0x50))(plVar1);
    }
    if (uVar4 == 0xffffffff) {
      if (t->_M_string_length == 0) {
        std::ios::clear((int)is + (int)is->_vptr_basic_istream[-3]);
      }
LAB_00118856:
      bVar3 = false;
    }
    else {
      if (uVar4 == 10) goto LAB_00118856;
      if (uVar4 == 0xd) {
        if ((byte *)plVar1[2] < (byte *)plVar1[3]) {
          uVar4 = (uint)*(byte *)plVar1[2];
        }
        else {
          uVar4 = (**(code **)(*plVar1 + 0x48))(plVar1);
        }
        if (uVar4 == 10) {
          if ((ulong)plVar1[2] < (ulong)plVar1[3]) {
            plVar1[2] = plVar1[2] + 1;
          }
          else {
            (**(code **)(*plVar1 + 0x50))(plVar1);
          }
        }
        goto LAB_00118856;
      }
      std::__cxx11::string::push_back((char)t);
      bVar3 = true;
    }
    if (!bVar3) {
      return is;
    }
  } while( true );
}

Assistant:

std::istream &safeGetline(std::istream &is, std::string &t) {
    t.clear();

    // The characters in the stream are read one-by-one using a std::streambuf.
    // That is faster than reading them one-by-one using the std::istream.
    // Code that uses streambuf this way must be guarded by a sentry object.
    // The sentry object performs various tasks,
    // such as thread synchronization and updating the stream state.

    std::istream::sentry se(is, true);
    std::streambuf *sb = is.rdbuf();

    for (;;) {
        int c = sb->sbumpc();
        switch (c) {
        case '\n':
            return is;
        case '\r':
            if (sb->sgetc() == '\n') {
                sb->sbumpc();
            }
            return is;
        case std::streambuf::traits_type::eof():
            // Also handle the case when the last line has no line ending
            if (t.empty()) {
                is.setstate(std::ios::eofbit);
            }
            return is;
        default:
            t += (char)c;
        }
    }
}